

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O1

string_view __thiscall absl::lts_20250127::StripAsciiWhitespace(lts_20250127 *this,string_view str)

{
  byte *pbVar1;
  ulong uVar2;
  long lVar3;
  lts_20250127 *plVar4;
  byte *pbVar5;
  lts_20250127 *plVar6;
  byte *pbVar7;
  ulong uVar8;
  string_view sVar9;
  
  pbVar5 = (byte *)str._M_len;
  pbVar1 = pbVar5;
  if (0 < (long)this >> 2) {
    pbVar1 = pbVar5 + ((ulong)this & 0xfffffffffffffffc);
    lVar3 = ((long)this >> 2) + 1;
    pbVar7 = pbVar5 + 3;
    do {
      if (((&ascii_internal::kPropertyBits)[pbVar7[-3]] & 8) == 0) {
        pbVar7 = pbVar7 + -3;
        goto LAB_002ab3dc;
      }
      if (((&ascii_internal::kPropertyBits)[pbVar7[-2]] & 8) == 0) {
        pbVar7 = pbVar7 + -2;
        goto LAB_002ab3dc;
      }
      if (((&ascii_internal::kPropertyBits)[pbVar7[-1]] & 8) == 0) {
        pbVar7 = pbVar7 + -1;
        goto LAB_002ab3dc;
      }
      if (((&ascii_internal::kPropertyBits)[*pbVar7] & 8) == 0) goto LAB_002ab3dc;
      lVar3 = lVar3 + -1;
      pbVar7 = pbVar7 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)(pbVar5 + (long)this) - (long)pbVar1;
  if (lVar3 == 1) {
LAB_002ab3c5:
    pbVar7 = pbVar1;
    if (((&ascii_internal::kPropertyBits)[*pbVar1] & 8) != 0) {
LAB_002ab3d9:
      pbVar7 = pbVar5 + (long)this;
    }
  }
  else if (lVar3 == 2) {
LAB_002ab39b:
    pbVar7 = pbVar1;
    if (((&ascii_internal::kPropertyBits)[*pbVar1] & 8) != 0) {
      pbVar1 = pbVar1 + 1;
      goto LAB_002ab3c5;
    }
  }
  else {
    if (lVar3 != 3) goto LAB_002ab3d9;
    pbVar7 = pbVar1;
    if (((&ascii_internal::kPropertyBits)[*pbVar1] & 8) != 0) {
      pbVar1 = pbVar1 + 1;
      goto LAB_002ab39b;
    }
  }
LAB_002ab3dc:
  plVar4 = (lts_20250127 *)(pbVar7 + -(long)pbVar5);
  uVar8 = (long)this - (long)plVar4;
  if (this < plVar4) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  sVar9._M_str = plVar4 + (long)pbVar5;
  plVar4 = this + (long)pbVar5;
  plVar6 = plVar4;
  if (0 < (long)uVar8 >> 2) {
    plVar6 = sVar9._M_str + ((uint)uVar8 & 3);
    lVar3 = ((long)uVar8 >> 2) + 1;
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)plVar4[-1]] & 8) == 0) goto LAB_002ab4c9;
      if (((&ascii_internal::kPropertyBits)[(byte)plVar4[-2]] & 8) == 0) {
        plVar4 = plVar4 + -1;
        goto LAB_002ab4c9;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)plVar4[-3]] & 8) == 0) {
        plVar4 = plVar4 + -2;
        goto LAB_002ab4c9;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)plVar4[-4]] & 8) == 0) {
        plVar4 = plVar4 + -3;
        goto LAB_002ab4c9;
      }
      plVar4 = plVar4 + -4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)plVar6 - (long)pbVar7;
  if (lVar3 != 1) {
    plVar4 = plVar6;
    if (lVar3 != 2) {
      plVar4 = sVar9._M_str;
      if ((lVar3 != 3) ||
         (plVar4 = plVar6, ((&ascii_internal::kPropertyBits)[(byte)plVar6[-1]] & 8) == 0))
      goto LAB_002ab4c9;
      plVar4 = plVar6 + -1;
    }
    if (((&ascii_internal::kPropertyBits)[(byte)plVar4[-1]] & 8) == 0) goto LAB_002ab4c9;
    plVar6 = plVar4 + -1;
  }
  plVar4 = plVar6;
  if (((&ascii_internal::kPropertyBits)[(byte)plVar6[-1]] & 8) != 0) {
    plVar4 = sVar9._M_str;
  }
LAB_002ab4c9:
  uVar2 = (long)plVar4 - (long)pbVar7;
  if (uVar8 < (ulong)((long)plVar4 - (long)pbVar7)) {
    uVar2 = uVar8;
  }
  sVar9._M_len = uVar2;
  return sVar9;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripAsciiWhitespace(
    absl::string_view str) {
  return StripTrailingAsciiWhitespace(StripLeadingAsciiWhitespace(str));
}